

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

bool duckdb::LogicalType::TryGetMaxLogicalType
               (ClientContext *context,LogicalType *left,LogicalType *right,LogicalType *result)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  DBConfig *pDVar4;
  LogicalType local_38;
  
  pDVar4 = DBConfig::GetConfig(context);
  if ((pDVar4->options).old_implicit_casting == true) {
    ForceMaxLogicalType(&local_38,left,right);
    result->id_ = local_38.id_;
    result->physical_type_ = local_38.physical_type_;
    peVar1 = (result->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (result->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (result->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_38.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (result->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_38.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_38.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    local_38.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2
    ;
    ~LogicalType(&local_38);
    return true;
  }
  bVar3 = TryGetMaxLogicalTypeInternal<duckdb::TryGetTypeOperation>(left,right,result);
  return bVar3;
}

Assistant:

bool LogicalType::TryGetMaxLogicalType(ClientContext &context, const LogicalType &left, const LogicalType &right,
                                       LogicalType &result) {
	if (DBConfig::GetConfig(context).options.old_implicit_casting) {
		result = LogicalType::ForceMaxLogicalType(left, right);
		return true;
	}
	return TryGetMaxLogicalTypeInternal<TryGetTypeOperation>(left, right, result);
}